

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void calc_attr_bonus(void)

{
  char cVar1;
  boolean bVar2;
  char cVar3;
  obj *abon_items [10];
  int local_c;
  int spe;
  int i;
  
  abon_items[0] = uarmu;
  abon_items[1] = uarmc;
  abon_items[2] = uarmh;
  abon_items[3] = uarms;
  abon_items[4] = uarmg;
  abon_items[5] = uarmf;
  abon_items[6] = uamul;
  abon_items[7] = uright;
  abon_items[8] = uleft;
  memset(&u.abon,0,6);
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    if ((abon_items[(long)local_c + -1] != (obj *)0x0) &&
       (bVar2 = equip_is_worn(abon_items[(long)local_c + -1]), bVar2 != '\0')) {
      cVar1 = abon_items[(long)local_c + -1]->spe;
      switch(abon_items[(long)local_c + -1]->otyp) {
      case 0x4c:
        cVar3 = -1;
        if (urole.malenum == 0x168) {
          cVar3 = '\x01';
        }
        u.abon.a[5] = u.abon.a[5] + cVar3;
        break;
      case 0x51:
        u.abon.a[1] = u.abon.a[1] + cVar1;
        u.abon.a[2] = u.abon.a[2] + cVar1;
        break;
      case 0x92:
        u.abon.a[3] = u.abon.a[3] + cVar1;
        break;
      case 0x9d:
        u.abon.a[5] = u.abon.a[5] + cVar1;
        break;
      case 0x9e:
        u.abon.a[0] = u.abon.a[0] + cVar1;
        break;
      case 0x9f:
        u.abon.a[4] = u.abon.a[4] + cVar1;
        break;
      case 0xa0:
        u.abon.a[1] = u.abon.a[1] + cVar1;
        break;
      case 0xa1:
        u.abon.a[2] = u.abon.a[2] + cVar1;
        break;
      case 0xa2:
        u.abon.a[3] = u.abon.a[3] + cVar1;
      }
      if ((abon_items[(long)local_c + -1]->oprops & 0x100U) != 0) {
        u.abon.a[3] = u.abon.a[3] + cVar1;
      }
      if ((abon_items[(long)local_c + -1]->oprops & 0x200U) != 0) {
        u.abon.a[1] = u.abon.a[1] + cVar1;
        u.abon.a[2] = u.abon.a[2] + cVar1;
      }
    }
  }
  return;
}

Assistant:

void calc_attr_bonus(void)
{
	int i, spe;
	struct obj *abon_items[] = { /* item slots that might affect abon */
		uarm /* body armor */,
		uarmu /* shirt */,
		uarmc /* cloak */,
		uarmh /* helmet */,
		uarms /* shield */,
		uarmg /* gloves */,
		uarmf /* boots */,
		uamul /* amulet */,
		uright/* right ring */,
		uleft /* left ring */,
	};
	
	memset(u.abon.a, 0, sizeof(u.abon.a));
	
	for (i = 0; i < SIZE(abon_items); i++) {
		if (!abon_items[i] || !equip_is_worn(abon_items[i]))
		    continue;
		
		spe = abon_items[i]->spe;
		switch (abon_items[i]->otyp) {
			case RIN_GAIN_STRENGTH:
			    ABON(A_STR) += spe;
			    break;
			    
			case RIN_GAIN_CONSTITUTION:
			    ABON(A_CON) += spe;
			    break;
			    
			case RIN_GAIN_INTELLIGENCE:
			    ABON(A_INT) += spe;
			    break;
			    
			case RIN_GAIN_WISDOM:
			    ABON(A_WIS) += spe;
			    break;
			    
			case RIN_GAIN_DEXTERITY:
			    ABON(A_DEX) += spe;
			    break;
			    
			case RIN_ADORNMENT:
			    ABON(A_CHA) += spe;
			    break;
			    
			case GAUNTLETS_OF_DEXTERITY:
			    ABON(A_DEX) += spe;
			    break;
			    
			case HELM_OF_BRILLIANCE:
			    ABON(A_INT) += spe;
			    ABON(A_WIS) += spe;
			    break;

			case CORNUTHAUM:
			    ABON(A_CHA) += (Role_if(PM_WIZARD) ? 1 : -1);
			    break;
		}

		if (abon_items[i]->oprops & ITEM_DEXTERITY) {
		    ABON(A_DEX) += spe;
		}

		if (abon_items[i]->oprops & ITEM_BRILLIANCE) {
		    ABON(A_INT) += spe;
		    ABON(A_WIS) += spe;
		}
	}
}